

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void __thiscall phyr::PathIntegrator::preprocess(PathIntegrator *this,Scene *scene,Sampler *sampler)

{
  unique_ptr<phyr::LightDistribution,_std::default_delete<phyr::LightDistribution>_> *in_RDI;
  unique_ptr<phyr::LightDistribution,_std::default_delete<phyr::LightDistribution>_>
  *in_stack_ffffffffffffffe0;
  
  createLightSampleDistribution((string *)scene,(Scene *)sampler);
  std::unique_ptr<phyr::LightDistribution,_std::default_delete<phyr::LightDistribution>_>::operator=
            (in_stack_ffffffffffffffe0,in_RDI);
  std::unique_ptr<phyr::LightDistribution,_std::default_delete<phyr::LightDistribution>_>::
  ~unique_ptr(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void PathIntegrator::preprocess(const Scene& scene, Sampler& sampler) {
    lightDistribution = createLightSampleDistribution(lightSampleStrategy, scene);
}